

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InetAddress.cpp
# Opt level: O2

void __thiscall higan::InetAddress::InetAddress(InetAddress *this)

{
  string local_40 [39];
  allocator<char> local_19;
  
  std::__cxx11::string::string<std::allocator<char>>(local_40,"FF.FF.FF.FF",&local_19);
  std::__cxx11::string::string((string *)this,local_40);
  this->port_ = -1;
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

InetAddress::InetAddress():
	InetAddress("FF.FF.FF.FF", -1)
{

}